

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O0

int i2c_block_process_call(uint handle,uint reg,char *buf,uint count)

{
  gpioExtent_t *in_RDX;
  int in_ESI;
  gpioExtent_t ext [1];
  int bytes;
  int in_stack_00000fc8;
  int in_stack_00000fcc;
  void *in_stack_00000fd0;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  int local_18;
  
  local_18 = pigpio_command_ext(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                                in_stack_ffffffffffffffd8,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,0
                                ,in_RDX,in_ESI);
  if (0 < local_18) {
    local_18 = recvMax(in_stack_00000fd0,in_stack_00000fcc,in_stack_00000fc8);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&command_mutex);
  return local_18;
}

Assistant:

int i2c_block_process_call(
   unsigned handle, unsigned reg, char *buf, unsigned count)
{
   int bytes;
   gpioExtent_t ext[1];

   /*
   p1=handle
   p2=reg
   p3=count
   ## extension ##
   char buf[count]
   */

   ext[0].size = count;
   ext[0].ptr = buf;

   bytes = pigpio_command_ext
      (gPigCommand, PI_CMD_I2CPK, handle, reg, count, 1, ext, 0);

   if (bytes > 0)
   {
      bytes = recvMax(buf, 32, bytes);
   }

   pthread_mutex_unlock(&command_mutex);

   return bytes;
}